

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O0

void A_Weave(AActor *self,int xyspeed,int zspeed,double xydist,double zdist)

{
  uint uVar1;
  double dVar2;
  undefined1 local_f0 [40];
  undefined1 local_c8 [20];
  TFlags<ActorFlag5,_unsigned_int> local_b4;
  TVector2<double> local_b0;
  TAngle<double> local_a0 [2];
  DVector3 local_90;
  undefined1 local_78 [32];
  TAngle<double> local_58;
  Angle local_50;
  double dist;
  DAngle angle;
  int weaveZ;
  int weaveXY;
  DVector2 newpos;
  double zdist_local;
  double xydist_local;
  int zspeed_local;
  int xyspeed_local;
  AActor *self_local;
  
  newpos.Y = zdist;
  TVector2<double>::TVector2((TVector2<double> *)&weaveZ);
  TAngle<double>::TAngle((TAngle<double> *)&dist);
  angle.Degrees._4_4_ = self->WeaveIndexXY & 0x3f;
  angle.Degrees._0_4_ = self->WeaveIndexZ & 0x3f;
  TAngle<double>::operator+(&local_58,90.0);
  TAngle<double>::operator=((TAngle<double> *)&dist,&local_58);
  if (((xydist != 0.0) || (NAN(xydist))) && (xyspeed != 0)) {
    dVar2 = BobSin((double)(int)angle.Degrees._4_4_);
    local_50.Degrees = dVar2 * xydist;
    AActor::Pos(&local_90,self);
    TVector3<double>::XY((TVector3<double> *)local_78);
    TAngle<double>::ToVector(local_a0,local_50.Degrees);
    TVector2<double>::operator-((TVector2<double> *)(local_78 + 0x10),(TVector2<double> *)local_78);
    TVector2<double>::operator=((TVector2<double> *)&weaveZ,(TVector2<double> *)(local_78 + 0x10));
    angle.Degrees._4_4_ = angle.Degrees._4_4_ + xyspeed & 0x3f;
    dVar2 = BobSin((double)angle.Degrees._4_4_);
    local_50.Degrees = dVar2 * xydist;
    TAngle<double>::ToVector((TAngle<double> *)&local_b0,local_50.Degrees);
    TVector2<double>::operator+=((TVector2<double> *)&weaveZ,&local_b0);
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_b4,
               (int)self +
               (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|MF5_NODROPOFF));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_b4);
    if (uVar1 == 0) {
      P_TryMove(self,(DVector2 *)&weaveZ,1,(secplane_t *)0x0);
    }
    else {
      AActor::UnlinkFromWorld(self);
      TFlags<ActorFlag,_unsigned_int>::operator|=(&self->flags,MF_NOBLOCKMAP);
      AActor::Pos((DVector3 *)(local_f0 + 0x10),self);
      TVector3<double>::XY((TVector3<double> *)local_c8);
      TVector2<double>::operator-=((TVector2<double> *)&weaveZ,(TVector2<double> *)local_c8);
      AActor::Vec2Offset((AActor *)local_f0,_weaveZ,newpos.X,SUB81(self,0));
      AActor::SetXY(self,(DVector2 *)local_f0);
      AActor::LinkToWorld(self,false,(sector_t *)0x0);
    }
    self->WeaveIndexXY = (BYTE)angle.Degrees._4_4_;
  }
  if (((newpos.Y != 0.0) || (NAN(newpos.Y))) && (zspeed != 0)) {
    dVar2 = BobSin((double)(int)angle.Degrees._0_4_);
    AActor::AddZ(self,-dVar2 * newpos.Y,true);
    angle.Degrees._0_4_ = angle.Degrees._0_4_ + zspeed & 0x3f;
    dVar2 = BobSin((double)angle.Degrees._0_4_);
    AActor::AddZ(self,dVar2 * newpos.Y,true);
    self->WeaveIndexZ = (BYTE)angle.Degrees._0_4_;
  }
  return;
}

Assistant:

void A_Weave(AActor *self, int xyspeed, int zspeed, double xydist, double zdist)
{
	DVector2 newpos;
	int weaveXY, weaveZ;
	DAngle angle;
	double dist;

	weaveXY = self->WeaveIndexXY & 63;
	weaveZ = self->WeaveIndexZ & 63;
	angle = self->Angles.Yaw + 90;

	if (xydist != 0 && xyspeed != 0)
	{
		dist = BobSin(weaveXY) * xydist;
		newpos = self->Pos().XY() - angle.ToVector(dist);
		weaveXY = (weaveXY + xyspeed) & 63;
		dist = BobSin(weaveXY) * xydist;
		newpos += angle.ToVector(dist);
		if (!(self->flags5 & MF5_NOINTERACTION))
		{
			P_TryMove (self, newpos, true);
		}
		else
		{
			self->UnlinkFromWorld ();
			self->flags |= MF_NOBLOCKMAP;
			// We need to do portal offsetting here explicitly, because SetXY cannot do that.
			newpos -= self->Pos().XY();
			self->SetXY(self->Vec2Offset(newpos.X, newpos.Y));
			self->LinkToWorld ();
		}
		self->WeaveIndexXY = weaveXY;
	}
	if (zdist != 0 && zspeed != 0)
	{
		self->AddZ(-BobSin(weaveZ) * zdist);
		weaveZ = (weaveZ + zspeed) & 63;
		self->AddZ(BobSin(weaveZ) * zdist);
		self->WeaveIndexZ = weaveZ;
	}
}